

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_internals.c
# Opt level: O1

TA_RetCode circBufferFillFrom0ToSize(int size,int *buffer)

{
  int iVar1;
  bool bVar2;
  undefined1 *__ptr;
  int iVar3;
  ulong uVar4;
  TA_RetCode TVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int local_MyBuf [4];
  undefined1 local_28 [24];
  
  __ptr = local_28;
  if ((size < 5) ||
     (__ptr = (undefined1 *)malloc((ulong)(uint)size << 2), __ptr != (undefined1 *)0x0)) {
    iVar1 = size + -1;
    iVar3 = 0;
    iVar6 = 0;
    if (0 < size) {
      iVar7 = 0;
      iVar3 = 0;
      do {
        *(int *)(__ptr + (long)iVar3 * 4) = iVar7;
        iVar7 = iVar7 + 1;
        bVar2 = iVar1 <= iVar3;
        iVar3 = iVar3 + 1;
        if (bVar2) {
          iVar3 = 0;
        }
        iVar6 = size;
      } while (size != iVar7);
    }
    lVar8 = 0;
    do {
      iVar7 = (int)lVar8;
      buffer[lVar8] = *(int *)(__ptr + (long)iVar3 * 4);
      lVar8 = lVar8 + 1;
      *(int *)(__ptr + (long)iVar3 * 4) = iVar6 + iVar7;
      bVar2 = iVar1 <= iVar3;
      iVar3 = iVar3 + 1;
      if (bVar2) {
        iVar3 = 0;
      }
    } while (lVar8 != 3);
    if (0 < size) {
      uVar4 = 3;
      do {
        buffer[uVar4] = *(int *)(__ptr + (long)iVar3 * 4);
        uVar4 = uVar4 + 1;
        bVar2 = iVar1 <= iVar3;
        iVar3 = iVar3 + 1;
        if (bVar2) {
          iVar3 = 0;
        }
      } while (size + 3 != uVar4);
    }
    TVar5 = TA_SUCCESS;
    if (__ptr != local_28) {
      free(__ptr);
      TVar5 = TA_SUCCESS;
    }
  }
  else {
    TVar5 = TA_ALLOC_ERR;
  }
  return TVar5;
}

Assistant:

static TA_RetCode circBufferFillFrom0ToSize( int size, int *buffer )
{
   CIRCBUF_PROLOG(MyBuf,int,4);
   int i, value;
   int outIdx;

   CIRCBUF_INIT(MyBuf,int,size);

   outIdx = 0;

   // 1st Loop: Fill MyBuf with initial values
   //           (must be done).
   value = 0;
   for( i=0; i < size; i++ )
   {
      MyBuf[MyBuf_Idx] = value++;
      CIRCBUF_NEXT(MyBuf);
   }

   // 2nd Loop: Get and Add subsequent values
   //           in MyBuf (optional)
   for( i=0; i < 3; i++ )
   {
      buffer[outIdx++] = MyBuf[MyBuf_Idx];
      MyBuf[MyBuf_Idx] = value++;
      CIRCBUF_NEXT(MyBuf);
   }

   // 3rd Loop: Empty MyBuf (optional)
   for( i=0; i < size; i++ )
   {
      buffer[outIdx++] = MyBuf[MyBuf_Idx];
      CIRCBUF_NEXT(MyBuf);
   }

   CIRCBUF_DESTROY(MyBuf);

   return TA_SUCCESS;
}